

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::protos::gen::TracingServiceState_TracingSession::TracingServiceState_TracingSession
          (TracingServiceState_TracingSession *this,TracingServiceState_TracingSession *param_1)

{
  uint32_t uVar1;
  TracingServiceState_TracingSession *param_1_local;
  TracingServiceState_TracingSession *this_local;
  
  protozero::CppMessageObj::CppMessageObj(&this->super_CppMessageObj,&param_1->super_CppMessageObj);
  (this->super_CppMessageObj)._vptr_CppMessageObj =
       (_func_int **)&PTR__TracingServiceState_TracingSession_009c1030;
  this->id_ = param_1->id_;
  this->consumer_uid_ = param_1->consumer_uid_;
  ::std::__cxx11::string::string((string *)&this->state_,(string *)&param_1->state_);
  ::std::__cxx11::string::string
            ((string *)&this->unique_session_name_,(string *)&param_1->unique_session_name_);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&this->buffer_size_kb_,&param_1->buffer_size_kb_);
  uVar1 = param_1->num_data_sources_;
  this->duration_ms_ = param_1->duration_ms_;
  this->num_data_sources_ = uVar1;
  this->start_realtime_ns_ = param_1->start_realtime_ns_;
  ::std::__cxx11::string::string
            ((string *)&this->unknown_fields_,(string *)&param_1->unknown_fields_);
  (this->_has_field_).super__Base_bitset<1UL>._M_w =
       (param_1->_has_field_).super__Base_bitset<1UL>._M_w;
  return;
}

Assistant:

TracingServiceState_TracingSession::TracingServiceState_TracingSession(TracingServiceState_TracingSession&&) noexcept = default;